

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::ub::StructType::addMember(StructType *this,char *name,VarType *type,deUint32 flags)

{
  StructMember local_50;
  
  StructMember::StructMember(&local_50,name,type,flags);
  std::vector<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>::
  emplace_back<deqp::gls::ub::StructMember>(&this->m_members,&local_50);
  StructMember::~StructMember(&local_50);
  return;
}

Assistant:

void StructType::addMember (const char* name, const VarType& type, deUint32 flags)
{
	m_members.push_back(StructMember(name, type, flags));
}